

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

QString * buddyString(QString *__return_storage_ptr__,QWidget *widget)

{
  QObject *object;
  long lVar1;
  long lVar2;
  QLabel *this;
  QWidget *pQVar3;
  QGroupBox *this_00;
  long lVar4;
  
  if ((widget != (QWidget *)0x0) &&
     (object = *(QObject **)(*(long *)&widget->field_0x8 + 0x10), object != (QObject *)0x0)) {
    lVar1 = *(long *)(*(long *)(object + 8) + 0x20);
    lVar2 = *(long *)(*(long *)(object + 8) + 0x28);
    for (lVar4 = 0; lVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
      this = QtPrivate::qobject_cast_helper<QLabel*,QObject>(*(QObject **)(lVar1 + lVar4));
      if ((this != (QLabel *)0x0) && (pQVar3 = QLabel::buddy(this), pQVar3 == widget)) {
        QLabel::text(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
    }
    this_00 = QtPrivate::qobject_cast_helper<QGroupBox*,QObject>(object);
    if (this_00 != (QGroupBox *)0x0) {
      QGroupBox::title(__return_storage_ptr__,this_00);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

static QString buddyString(const QWidget *widget)
{
    if (!widget)
        return QString();
    QWidget *parent = widget->parentWidget();
    if (!parent)
        return QString();
#if QT_CONFIG(shortcut) && QT_CONFIG(label)
    for (QObject *o : parent->children()) {
        QLabel *label = qobject_cast<QLabel*>(o);
        if (label && label->buddy() == widget)
            return label->text();
    }
#endif

#if QT_CONFIG(groupbox)
    QGroupBox *groupbox = qobject_cast<QGroupBox*>(parent);
    if (groupbox)
        return groupbox->title();
#endif

    return QString();
}